

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O1

bool __thiscall de::FilePath::exists(FilePath *this)

{
  int iVar1;
  FilePath normPath;
  stat st;
  FilePath local_c0;
  stat local_a0;
  
  normalize(&local_c0,this);
  iVar1 = stat(local_c0.m_path._M_dataplus._M_p,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_path._M_dataplus._M_p != &local_c0.m_path.field_2) {
    operator_delete(local_c0.m_path._M_dataplus._M_p,
                    local_c0.m_path.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool FilePath::exists (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);
	return result == 0;
}